

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O0

int main(void)

{
  int iVar1;
  GLFWwindow *pGVar2;
  undefined4 local_4c;
  int local_48;
  int local_44;
  int bottom;
  int right;
  int top;
  int left;
  GLFWwindow *windows [4];
  uint local_10;
  GLboolean running;
  int i;
  
  windows[3]._7_1_ = '\x01';
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    exit(1);
  }
  glfwWindowHint(0x20004,0);
  local_10 = 0;
  while( true ) {
    if (3 < (int)local_10) {
      for (local_10 = 0; (int)local_10 < 4; local_10 = local_10 + 1) {
        glfwShowWindow(*(GLFWwindow **)(&top + (long)(int)local_10 * 2));
      }
      while (windows[3]._7_1_ != '\0') {
        for (local_10 = 0; (int)local_10 < 4; local_10 = local_10 + 1) {
          glfwMakeContextCurrent(*(GLFWwindow **)(&top + (long)(int)local_10 * 2));
          glClear(0x4000);
          glfwSwapBuffers(*(GLFWwindow **)(&top + (long)(int)local_10 * 2));
          iVar1 = glfwWindowShouldClose(*(GLFWwindow **)(&top + (long)(int)local_10 * 2));
          if (iVar1 != 0) {
            windows[3]._7_1_ = '\0';
          }
        }
        glfwPollEvents();
      }
      glfwTerminate();
      exit(0);
    }
    pGVar2 = glfwCreateWindow(200,200,titles[(int)local_10],(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    *(GLFWwindow **)(&top + (long)(int)local_10 * 2) = pGVar2;
    if (*(long *)(&top + (long)(int)local_10 * 2) == 0) break;
    glfwSetKeyCallback(*(GLFWwindow **)(&top + (long)(int)local_10 * 2),key_callback);
    glfwMakeContextCurrent(*(GLFWwindow **)(&top + (long)(int)local_10 * 2));
    local_4c = 0;
    if (local_10 == 0) {
      local_4c = 0x3f800000;
    }
    glClearColor((float)(local_10 & 1),(float)((int)local_10 >> 1),local_4c,0);
    glfwGetWindowFrameSize
              (*(GLFWwindow **)(&top + (long)(int)local_10 * 2),&right,&bottom,&local_44,&local_48);
    glfwSetWindowPos(*(GLFWwindow **)(&top + (long)(int)local_10 * 2),
                     (local_10 & 1) * (right + 200 + local_44) + 100,
                     ((int)local_10 >> 1) * (bottom + 200 + local_48) + 100);
    local_10 = local_10 + 1;
  }
  glfwTerminate();
  exit(1);
}

Assistant:

int main(void)
{
    int i;
    GLboolean running = GL_TRUE;
    GLFWwindow* windows[4];

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_VISIBLE, GL_FALSE);

    for (i = 0;  i < 4;  i++)
    {
        int left, top, right, bottom;

        windows[i] = glfwCreateWindow(200, 200, titles[i], NULL, NULL);
        if (!windows[i])
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glfwSetKeyCallback(windows[i], key_callback);

        glfwMakeContextCurrent(windows[i]);
        glClearColor((GLclampf) (i & 1),
                     (GLclampf) (i >> 1),
                     i ? 0.f : 1.f,
                     0.f);

        glfwGetWindowFrameSize(windows[i], &left, &top, &right, &bottom);
        glfwSetWindowPos(windows[i],
                         100 + (i & 1) * (200 + left + right),
                         100 + (i >> 1) * (200 + top + bottom));
    }

    for (i = 0;  i < 4;  i++)
        glfwShowWindow(windows[i]);

    while (running)
    {
        for (i = 0;  i < 4;  i++)
        {
            glfwMakeContextCurrent(windows[i]);
            glClear(GL_COLOR_BUFFER_BIT);
            glfwSwapBuffers(windows[i]);

            if (glfwWindowShouldClose(windows[i]))
                running = GL_FALSE;
        }

        glfwPollEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}